

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O0

void __thiscall lscpp::comm_logger::open_in(comm_logger *this)

{
  int __oflag;
  allocator<char> local_31;
  string local_30 [32];
  comm_logger *local_10;
  comm_logger *this_local;
  
  if ((this->file_open_ & 1U) == 0) {
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_30,".in",&local_31);
    open(this,(char *)local_30,__oflag);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return;
}

Assistant:

void comm_logger::open_in() {
  if (!file_open_)
    open(".in");
}